

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

char * __thiscall snappy::SnappySinkAllocator::Allocate(SnappySinkAllocator *this,int size)

{
  ulong uVar1;
  Datablock block;
  
  uVar1 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar1 = (long)size;
  }
  block.data = (char *)operator_new__(uVar1);
  block.size = (long)size;
  std::
  vector<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
  ::push_back(&this->blocks_,&block);
  return block.data;
}

Assistant:

char* Allocate(int size) {
    Datablock block(new char[size], size);
    blocks_.push_back(block);
    return block.data;
  }